

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

bool draco::ReadFileToBuffer(string *file_name,vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  pointer pFVar4;
  undefined8 in_RSI;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  file_reader;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  *in_stack_ffffffffffffffd0;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  FileReaderFactory::OpenReader
            ((string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  bVar1 = std::operator==(in_stack_ffffffffffffffd0,
                          (nullptr_t)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (bVar1) {
    bVar2 = 0;
  }
  else {
    pFVar4 = std::
             unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
             ::operator->((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                           *)0x11089a);
    iVar3 = (*pFVar4->_vptr_FileReaderInterface[2])(pFVar4,in_RSI);
    bVar2 = (byte)iVar3 & 1;
  }
  std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>::
  ~unique_ptr(in_stack_ffffffffffffffe0);
  return (bool)(bVar2 & 1);
}

Assistant:

bool ReadFileToBuffer(const std::string &file_name, std::vector<char> *buffer) {
  std::unique_ptr<FileReaderInterface> file_reader =
      FileReaderFactory::OpenReader(file_name);
  if (file_reader == nullptr) {
    return false;
  }
  return file_reader->ReadFileToBuffer(buffer);
}